

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.cpp
# Opt level: O2

int __thiscall
sc_core::sc_phash_base::remove_by_contents(sc_phash_base *this,void *c,_func_void_void_ptr *kfree)

{
  long lVar1;
  int iVar2;
  sc_phash_elem **ppsVar3;
  sc_phash_elem *p;
  
  iVar2 = 0;
  for (lVar1 = 0; lVar1 < this->num_bins; lVar1 = lVar1 + 1) {
    ppsVar3 = this->bins + lVar1;
    p = *ppsVar3;
    while (p != (sc_phash_elem *)0x0) {
      if (p->contents == c) {
        *ppsVar3 = p->next;
        (*kfree)(p->key);
        sc_mempool::release(p,0x18);
        p = *ppsVar3;
        this->num_entries = this->num_entries + -1;
        iVar2 = iVar2 + 1;
      }
      else {
        ppsVar3 = &p->next;
        p = p->next;
      }
    }
  }
  return iVar2;
}

Assistant:

int
sc_phash_base::remove_by_contents( const void* c, void (*kfree)(void*) )
{
    sc_phash_elem** last;
    sc_phash_elem*  ptr;

    int num_removed = 0;
    for (int i = 0; i < num_bins; ++i) {
        last = &(bins[i]);
        ptr = *last;
        while (ptr != 0) {
            if (ptr->contents != c) {
                last = &(ptr->next);
                ptr  = *last;
            }
            else {
                *last = ptr->next;
                (*kfree)(ptr->key);
                delete ptr;
                ptr = *last;
                --num_entries;
                ++num_removed;
            }
        }
    }
    return num_removed;
}